

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O3

void __thiscall Simulator::fetch(Simulator *this)

{
  uint32_t *puVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  undefined8 uVar13;
  uint uVar14;
  uint32_t uVar15;
  InstSet local_50;
  uint local_4c;
  uint local_48;
  long lVar9;
  
  uVar8 = (this->f_reg).out.pred_pc;
  if ((uVar8 & 1) != 0) {
    raiseError(this,"PC 0x%llx is illegal!\n",uVar8);
  }
  if ((this->e_reg).super_ClockReg<Simulator::ERegX>.out.opcode == 0x67) {
    uVar8 = (long)(this->e_reg).super_ClockReg<Simulator::ERegX>.out.imm +
            (this->e_reg).super_ClockReg<Simulator::ERegX>.out.val1 & 0xfffffffffffffffe;
  }
  if ((this->m_reg).super_ClockReg<Simulator::MRegX>.out.opcode == 99) {
    puVar1 = &(this->history).branch_count;
    *puVar1 = *puVar1 + 1;
    bVar2 = BranchPredictor::predict
                      (this->branch_predictor,
                       (uint32_t)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc,
                       (long)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.imm);
    BranchPredictor::update
              (this->branch_predictor,
               (uint32_t)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc,
               (this->m_reg).super_ClockReg<Simulator::MRegX>.out.valE != 0);
    if ((this->m_reg).super_ClockReg<Simulator::MRegX>.out.valE == (ulong)bVar2) {
      puVar1 = &(this->history).predicted_success;
      *puVar1 = *puVar1 + 1;
    }
    else {
      lVar9 = 4;
      if (!bVar2) {
        lVar9 = (long)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.imm;
      }
      uVar8 = lVar9 + (this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc;
      puVar1 = &(this->history).predicted_unsuccess;
      *puVar1 = *puVar1 + 1;
    }
  }
  uVar4 = MemoryManager::getInt(this->memory,(uint32_t)uVar8,(uint32_t *)0x0);
  if (this->is_verbose == true) {
    printf("\tINST:%x",(ulong)uVar4);
  }
  uVar6 = uVar4 >> 7;
  uVar12 = uVar4 & 0x7f;
  uVar15 = uVar4 >> 0xc & 7;
  local_48 = uVar6 & 0x1f;
  uVar10 = uVar4 >> 0xf & 0x1f;
  uVar5 = uVar4 >> 0x14;
  local_4c = uVar5 & 0x1f;
  uVar14 = (int)uVar4 >> 0x14;
  if (uVar12 < 0x33) {
    if (uVar12 < 0x17) {
      if (uVar12 == 0) {
        uVar14 = 0;
        local_50 = UNKNOWN;
        goto LAB_0010888a;
      }
      if (uVar12 == 3) {
        switch(uVar15) {
        case 0:
          local_50 = LB;
          break;
        case 1:
          local_50 = LH;
          break;
        case 2:
          local_50 = LW;
          break;
        case 3:
          local_50 = LD;
          break;
        case 4:
          local_50 = LBU;
          break;
        case 5:
          local_50 = LHU;
          break;
        case 6:
          local_50 = LWU;
          break;
        case 7:
          pcVar11 = "Invaild LOAD Instruction at %x, The Func Field %x is invaild\n";
          uVar7 = 7;
          goto LAB_00108a35;
        }
      }
      else {
        if (uVar12 != 0x13) goto LAB_00108a0e;
        switch(uVar15) {
        case 0:
          local_50 = ADDI;
          break;
        case 1:
          local_50 = SLLI;
          break;
        case 2:
          local_50 = SLTI;
          break;
        case 3:
          local_50 = SLTIU;
          break;
        case 4:
          local_50 = XORI;
          break;
        case 5:
          uVar5 = uVar4 >> 0x1a;
          uVar7 = (ulong)uVar5;
          local_50 = SRLI;
          if (uVar5 != 0) {
            if (uVar5 != 0x10) {
              pcVar11 = 
              "Invaild RI Instruction at %x, The Func3 field is %x, The Func7 Field %x is invaild\n"
              ;
              goto LAB_00108ab1;
            }
            local_50 = SRAI;
          }
          break;
        case 6:
          local_50 = ORI;
          break;
        case 7:
          local_50 = ANDI;
        }
      }
    }
    else {
      if (uVar12 == 0x17) {
        uVar14 = uVar4 & 0xfffff000;
        local_50 = AUIPC;
        goto LAB_001084cd;
      }
      if (uVar12 != 0x1b) {
        if (uVar12 != 0x23) goto LAB_00108a0e;
        if (uVar15 < 4) {
          local_50 = *(InstSet *)(&DAT_0010d190 + (ulong)uVar15 * 4);
          uVar14 = (int)(uVar4 & 0xfe000000 | local_48 << 0x14) >> 0x14;
          local_48 = 0;
          goto LAB_0010888a;
        }
        pcVar11 = "Invaild STORE Instruction at %x, The Func Field %x is invaild\n";
LAB_00108a2c:
        uVar7 = (ulong)uVar15;
LAB_00108a35:
        raiseError(this,pcVar11,uVar8,uVar7);
      }
      if (uVar15 == 0) {
        local_50 = ADDIW;
      }
      else if (uVar15 == 5) {
        local_50 = SRAIW;
        if (((uVar4 & 0xc0000000) != 0x40000000) && (local_50 = SRLIW, 0x3fffffff < uVar4)) {
          pcVar11 = "Invaild RIW Instruction at %x, The Func Field %x is invaild\n";
          uVar7 = 5;
          goto LAB_00108a35;
        }
      }
      else {
        if (uVar15 != 1) {
          pcVar11 = "Invaild RIW Instruction at %x, The Func Field %x is invaild\n";
          goto LAB_00108a2c;
        }
        local_50 = SLLIW;
      }
    }
  }
  else {
    if (uVar12 < 99) {
      if (uVar12 == 0x33) {
        switch(uVar15) {
        case 0:
          local_50 = ADD;
          if (0x1ffffff < uVar4) {
            local_50 = MUL;
            if (uVar4 >> 0x19 != 1) {
              if (uVar4 >> 0x19 != 0x20) {
                pcVar11 = 
                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                ;
LAB_00108a9f:
                uVar7 = (ulong)(uVar4 >> 0x19);
                uVar13 = 0;
                goto LAB_00108abd;
              }
              local_50 = SUB;
            }
          }
          break;
        case 1:
          local_50 = SLL;
          if (0x1ffffff < uVar4) {
            uVar7 = (ulong)(uVar4 >> 0x19);
            local_50 = MULH;
            if (uVar4 >> 0x19 != 1) {
              pcVar11 = 
              "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
              ;
              uVar13 = 1;
              goto LAB_00108abd;
            }
          }
          break;
        case 2:
          local_50 = SLT;
          if (0x1ffffff < uVar4) {
            uVar7 = (ulong)(uVar4 >> 0x19);
            local_50 = MULHSU;
            if (uVar4 >> 0x19 != 1) {
              pcVar11 = 
              "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
              ;
              uVar13 = 2;
              goto LAB_00108abd;
            }
          }
          break;
        case 3:
          local_50 = SLTU;
          if (0x1ffffff < uVar4) {
            uVar7 = (ulong)(uVar4 >> 0x19);
            local_50 = MULHU;
            if (uVar4 >> 0x19 != 1) {
              pcVar11 = 
              "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
              ;
              uVar13 = 3;
              goto LAB_00108abd;
            }
          }
          break;
        case 4:
          local_50 = XOR;
          if (0x1ffffff < uVar4) {
            uVar7 = (ulong)(uVar4 >> 0x19);
            local_50 = DIV;
            if (uVar4 >> 0x19 != 1) {
              pcVar11 = 
              "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
              ;
              uVar13 = 4;
              goto LAB_00108abd;
            }
          }
          break;
        case 5:
          local_50 = SRL;
          if (0x1ffffff < uVar4) {
            uVar14 = uVar4 >> 0x19;
            uVar7 = (ulong)uVar14;
            local_50 = SRA;
            if (uVar14 != 0x20) {
              if (uVar14 != 1) {
                pcVar11 = 
                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                ;
LAB_00108ab1:
                uVar13 = 5;
                goto LAB_00108abd;
              }
              local_50 = DIVU;
            }
          }
          break;
        case 6:
          local_50 = OR;
          if ((0x1ffffff < uVar4) && (local_50 = REM, uVar4 >> 0x19 != 1)) {
            pcVar11 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
LAB_00108a7e:
            uVar7 = (ulong)(uVar4 >> 0x19);
            uVar13 = 6;
LAB_00108abd:
            raiseError(this,pcVar11,uVar8,uVar7,uVar13);
          }
          break;
        case 7:
          local_50 = AND;
          if ((0x1ffffff < uVar4) && (local_50 = REMU, uVar4 >> 0x19 != 1)) {
            pcVar11 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
LAB_001087d4:
            uVar7 = (ulong)(uVar4 >> 0x19);
            uVar13 = 7;
            goto LAB_00108abd;
          }
        }
      }
      else {
        if (uVar12 == 0x37) {
          uVar14 = uVar4 & 0xfffff000;
          local_50 = LUI;
          goto LAB_001084cd;
        }
        if (uVar12 != 0x3b) goto LAB_00108a0e;
        switch(uVar15) {
        case 0:
          local_50 = ADDW;
          if (0x1ffffff < uVar4) {
            local_50 = MULW;
            if (uVar4 >> 0x19 != 1) {
              if (uVar4 >> 0x19 != 0x20) {
                pcVar11 = 
                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                ;
                goto LAB_00108a9f;
              }
              local_50 = SUBW;
            }
          }
          break;
        case 1:
          local_50 = SLLW;
          break;
        default:
          raiseError(this,
                     "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,uVar8,(ulong)(uVar4 >> 0x19),(ulong)uVar15);
        case 4:
          local_50 = DIVW;
          break;
        case 5:
          local_50 = SRLW;
          if (0x1ffffff < uVar4) {
            uVar14 = uVar4 >> 0x19;
            uVar7 = (ulong)uVar14;
            local_50 = SRAW;
            if (uVar14 != 0x20) {
              if (uVar14 != 1) {
                pcVar11 = 
                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                ;
                goto LAB_00108ab1;
              }
              local_50 = DIVUW;
            }
          }
          break;
        case 6:
          local_50 = REMW;
          if (uVar4 >> 0x19 != 1) {
            pcVar11 = 
            "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            goto LAB_00108a7e;
          }
          break;
        case 7:
          local_50 = REMUW;
          if (uVar4 >> 0x19 != 1) {
            pcVar11 = 
            "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            goto LAB_001087d4;
          }
        }
      }
      uVar14 = 0;
      uVar15 = uVar15 + (uVar4 >> 0x19) * 8;
      goto LAB_0010888a;
    }
    if (uVar12 < 0x6f) {
      if (uVar12 != 99) {
        if (uVar12 != 0x67) goto LAB_00108a0e;
        local_4c = 0;
        local_50 = JALR;
        goto LAB_0010888a;
      }
      if ((0xf3U >> (uVar4 >> 0xc & 7) & 1) != 0) {
        local_50 = *(InstSet *)(&DAT_0010d1a0 + (ulong)uVar15 * 4);
        uVar14 = (int)(uVar4 & 0x80000000 |
                      ((uVar6 & 1) << 0xb | uVar5 & 0x7e0 | uVar6 & 0x1e) << 0x13) >> 0x13;
        local_48 = 0;
        if (this->is_verbose == true) {
          local_48 = 0;
          printf("\timm:%x",(ulong)uVar14);
        }
        goto LAB_0010888a;
      }
      pcVar11 = "Invaild BRANCH Instruction at %x, The Func Field %x is invaild\n";
      goto LAB_00108a2c;
    }
    if (uVar12 != 0x6f) {
      if (uVar12 != 0x73) {
LAB_00108a0e:
        raiseError(this,"Invaild Instruction %x at %x\n",(ulong)uVar4,uVar8);
      }
      local_4c = 0x11;
      local_50 = ECALL;
      uVar10 = 10;
      uVar15 = 0;
      local_48 = 10;
      uVar14 = 0;
      goto LAB_0010888a;
    }
    local_50 = JAL;
    uVar14 = (int)(uVar4 & 0x80000000 |
                  (uVar4 & 0xff000 | (uVar5 & 1) << 0xb | uVar5 & 0x7fe) << 0xb) >> 0xb;
LAB_001084cd:
    uVar15 = 0;
    uVar10 = 0;
  }
  local_4c = 0;
LAB_0010888a:
  if (this->is_verbose == true) {
    printf("\tIF: %s",*(undefined8 *)(RISCV_GRX::INSTNAME + (ulong)local_50 * 8));
    printf("\tpc: %lx",uVar8);
  }
  if (uVar12 == 99) {
    bVar2 = BranchPredictor::predict(this->branch_predictor,(uint32_t)uVar8,(long)(int)uVar14);
    if (this->is_verbose == true) {
      pcVar11 = "not";
      if (bVar2) {
        pcVar11 = "";
      }
      printf("Predict: branch %staken.\n",pcVar11);
    }
    lVar9 = 4;
    if (bVar2) {
      lVar9 = (long)(int)uVar14;
    }
  }
  else {
    lVar9 = 4;
    if (uVar12 == 0x6f) {
      puVar1 = &(this->history).jal_count;
      *puVar1 = *puVar1 + 1;
      lVar9 = (long)(int)uVar14;
    }
  }
  bVar3 = this->is_verbose;
  if ((bool)bVar3 == true) {
    printf("\tpred_pc: %lx\n",lVar9 + uVar8);
    bVar3 = this->is_verbose;
  }
  (this->f_reg).in.pred_pc = lVar9 + uVar8;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.opcode = uVar12;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.func = uVar15;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.rs1 = uVar10;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.rs2 = local_4c;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.rd = local_48;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.imm = uVar14;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.pc = uVar8;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.inst = local_50;
  if ((bVar3 & 1) != 0) {
    printf("Fetch instruction 0x%x at 0x%lx\n",(ulong)uVar4,uVar8);
    return;
  }
  return;
}

Assistant:

void Simulator::fetch() {
//    if (e_reg.out.stall_count != 0)
//        return;
    uint64_t pc = f_reg.out.pred_pc;
    if (pc % 2 != 0) {
        this->raiseError("PC 0x%llx is illegal!\n", pc);
    }
    if (e_reg.out.opcode == OP_JALR) {
        pc = (uint64_t) (e_reg.out.val1 + e_reg.out.imm) & ~1LLu;
    }

    if (m_reg.out.opcode == OP_BRANCH) {
        history.branch_count++;
        bool b = branch_predictor->predict(m_reg.out.pc, m_reg.out.imm);
        branch_predictor->update(m_reg.out.pc, m_reg.out.valE);
        if (b ^ m_reg.out.valE) {
            pc = m_reg.out.pc + (b ? 4 : m_reg.out.imm);
            history.predicted_unsuccess++;
        } else {
            history.predicted_success++;
        }
    }

    uint32_t inst = memory->getInt(pc);
    if (is_verbose) {
        printf("\tINST:%x", inst);
    }
    InstSet inst_t = UNKNOWN;

    uint32_t opcode = inst & 0x7fu;
    uint32_t func = (inst >> 12u) & 0x7u;
    uint32_t rs1 = (inst >> 15u) & 0x1fu;
    uint32_t rs2 = (inst >> 20u) & 0x1fu;
    uint32_t rd = (inst >> 7u) & 0x1fu;
    int32_t imm = 0;
    //uint32_t stall_count = 1;

    if (inst == 0) {
        opcode = OP_BUBBLE;
    }

    switch (opcode) {
        case OP_ECALL:
            func = 0;
            rs1 = REG_A0;
            //rd = REG_A5;
            rd = REG_A0;
            rs2 = REG_A7;
            inst_t = ECALL;
            //stall_count = CALU_BIT;
            break;
        case OP_RR: {
            // R-Type
            switch (func) {
                case 0x0:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_ADD;
                        inst_t = ADD;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MUL;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_ADD;
                        inst_t = SUB;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x1:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLL;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULH;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x2:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLT;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULHSU;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x3:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLTU;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULHU;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x4:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = XOR;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = DIV;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x5:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SRL;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_BIT;
                        inst_t = SRA;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = DIVU;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x6:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = OR;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = REM;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x7:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = AND;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = REMU;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                default:
                    this->raiseError("Invaild RR Instruction at %x, The Func3 Field %x is invaild\n", pc, func);
                    break;
            }
            func |= inst >> 25u << 3u;
            break;
        }
        case OP_32: {
            switch (func) {
                case 0x0:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_ADD;
                        inst_t = ADDW;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL_32;
                        inst_t = MULW;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_ADD;
                        inst_t = SUBW;
                    } else
                        this->raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLW;
                    break;
                case 0x4:
                    //stall_count = CALU_DIV_32;
                    inst_t = DIVW;
                    break;
                case 0x5:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SRLW;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_BIT;
                        inst_t = SRAW;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = DIVUW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x6:
                    if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = REMW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x7:
                    if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = REMUW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                default:
                    raiseError("Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                               pc, inst >> 25u, func);
                    break;
            }
            func |= inst >> 25u << 3u;
            break;
        }
        case OP_JALR: // I-Type
            //stall_count = CALU_ADD;
            inst_t = JALR;
            rs2 = 0;
            imm = (int) inst >> 20u;
            break;
        case OP_LOAD:
            //stall_count = CALU_ADD;
            switch (func) {
                case 0x0:
                    inst_t = LB;
                    break;
                case 0x1:
                    inst_t = LH;
                    break;
                case 0x2:
                    inst_t = LW;
                    break;
                case 0x3:
                    inst_t = LD;
                    break;
                case 0x4:
                    inst_t = LBU;
                    break;
                case 0x5:
                    inst_t = LHU;
                    break;
                case 0x6:
                    inst_t = LWU;
                    break;
                default:
                    this->raiseError("Invaild LOAD Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20;
            break;
        case OP_IMM:
            switch (func) {
                case 0x0:
                    //stall_count = CALU_ADD;
                    inst_t = ADDI;
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLI;
                    break;
                case 0x2:
                    //stall_count = CALU_BIT;
                    inst_t = SLTI;
                    break;
                case 0x3:
                    //stall_count = CALU_BIT;
                    inst_t = SLTIU;
                    break;
                case 0x4:
                    //stall_count = CALU_BIT;
                    inst_t = XORI;
                    break;
                case 0x5: {
                    switch (inst >> 26u) {
                        case 0x00:
                            //stall_count = CALU_BIT;
                            inst_t = SRLI;
                            break;
                        case 0x10:
                            //stall_count = CALU_BIT;
                            inst_t = SRAI;
                            break;
                        default:
                            this->raiseError(
                                    "Invaild RI Instruction at %x, The Func3 field is %x, The Func7 Field %x is invaild\n",
                                    pc, inst >> 26u, func);
                            break;
                    }
                    break;
                }
                case 0x6:
                    //stall_count = CALU_BIT;
                    inst_t = ORI;
                    break;
                case 0x7:
                    //stall_count = CALU_BIT;
                    inst_t = ANDI;
                    break;
                default:
                    this->raiseError("Invaild RI Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20u;
            break;
        case OP_IMM_32:
            switch (func) {
                case 0x0:
                    //stall_count = CALU_ADD;
                    inst_t = ADDIW;
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLIW;
                    break;
                case 0x5:
                    if (inst >> 30u == 1) {
                        //stall_count = CALU_BIT;
                        inst_t = SRAIW;
                    } else if (inst >> 30u == 0) {
                        //stall_count = CALU_BIT;
                        inst_t = SRLIW;
                    } else {
                        this->raiseError("Invaild RIW Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    }
                    break;
                default:
                    this->raiseError("Invaild RIW Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20;
            //is this right?
            break;
        case OP_STORE: // S-Type
            //stall_count = CALU_ADD;
            switch (func) {
                case 0x0:
                    inst_t = SB;
                    break;
                case 0x1:
                    inst_t = SH;
                    break;
                case 0x2:
                    inst_t = SW;
                    break;
                case 0x3:
                    inst_t = SD;
                    break;
                default:
                    this->raiseError("Invaild STORE Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rd = 0;
            imm = (inst >> 7u & 0x1fu) | inst >> 25u << 5u;
            imm = (int) imm << 20 >> 20;
            // is this right?
            break;
        case OP_BRANCH://SB-Type
            //stall_count = CALU_BIT;
            switch (func) {
                case 0x0:
                    inst_t = BEQ;
                    break;
                case 0x1:
                    inst_t = BNE;
                    break;
                case 0x4:
                    inst_t = BLT;
                    break;
                case 0x5:
                    inst_t = BGE;
                    break;
                case 0x6:
                    inst_t = BLTU;
                    break;
                case 0x7:
                    inst_t = BGEU;
                    break;
                default:
                    this->raiseError("Invaild BRANCH Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rd = 0;
            imm = (inst >> 8u & 0xfu) << 1u | (inst >> 25u & 0x3fu) << 5u | (inst >> 7u & 0x1u) << 11u |
                  inst >> 31u << 12u;
            imm = (int) imm << 19u >> 19u;
            if (is_verbose) {
                printf("\timm:%x", imm);
            }
            // is this right?
            break;
        case OP_LUI://U-Type
            inst_t = LUI;
            //stall_count = CALU_BIT;
            func = rs1 = rs2 = 0;
            imm = (int) inst >> 12u << 12u;
            //is this right?
            break;
        case OP_AUIPC:
            inst_t = AUIPC;
            //stall_count = CALU_ADD;
            func = rs1 = rs2 = 0;
            imm = (int) inst >> 12u << 12u;
            // is this right?
            break;
        case OP_JAL://UJ-Type
            //stall_count = CALU_ADD;
            inst_t = JAL;
            func = rs1 = rs2 = 0;
            imm = (inst >> 21u & 0x3ffu) << 1u | (inst >> 20u & 1u) << 11u | (inst >> 12u & 0xffu) << 12u |
                  inst >> 31u << 20u;
            imm = (int) imm << 11u >> 11u;
            // is this right?
            break;
        case OP_BUBBLE:
            break;
        default:
            this->raiseError("Invaild Instruction %x at %x\n", inst, pc);
            break;

    }
    if (is_verbose) {
        printf("\tIF: %s", INSTNAME[inst_t]);
        printf("\tpc: %lx", pc);
    }
    uint64_t pred_pc;
    if (opcode == OP_JAL) {
        history.jal_count++;
        pred_pc = pc + imm;
    } else if (opcode == OP_BRANCH) {
        bool b = branch_predictor->predict(pc, imm);
        if (is_verbose) {
            printf("Predict: branch %staken.\n", b ? "" : "not");
        }
        pred_pc = pc + (b ? imm : 4);
    } else {
        pred_pc = pc + 4;
    }
    if (is_verbose) {
        printf("\tpred_pc: %lx\n", pred_pc);
    }
    f_reg.in.pred_pc = pred_pc;

    //d_reg.in.stall_count = stall_count;
    d_reg.in.opcode = opcode;
    d_reg.in.func = func;
    d_reg.in.rs1 = rs1;
    d_reg.in.rs2 = rs2;
    d_reg.in.rd = rd;
    d_reg.in.imm = imm;
    d_reg.in.pc = pc;
    d_reg.in.inst = inst_t;

    if (this->is_verbose) {
        printf("Fetch instruction 0x%x at 0x%lx\n", inst, pc);
    }
}